

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xeTestCaseResult.hpp
# Opt level: O0

void __thiscall xe::ri::ShaderProgram::~ShaderProgram(ShaderProgram *this)

{
  ShaderProgram *this_local;
  
  (this->super_Item)._vptr_Item = (_func_int **)&PTR__ShaderProgram_0018d748;
  InfoLog::~InfoLog(&this->linkInfoLog);
  List::~List(&this->shaders);
  Item::~Item(&this->super_Item);
  return;
}

Assistant:

~ShaderProgram		(void) {}